

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMChildNode.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMChildNode::getPreviousSibling(DOMChildNode *this,DOMNode *thisNode)

{
  bool bVar1;
  DOMNodeImpl *this_00;
  DOMNode *local_28;
  DOMNode *thisNode_local;
  DOMChildNode *this_local;
  
  this_00 = xercesc_4_0::castToNodeImpl(thisNode);
  bVar1 = DOMNodeImpl::isFirstChild(this_00);
  if (bVar1) {
    local_28 = (DOMNode *)0x0;
  }
  else {
    local_28 = this->previousSibling;
  }
  return local_28;
}

Assistant:

DOMNode * DOMChildNode::getPreviousSibling(const DOMNode *thisNode) const {
    // if we are the firstChild, previousSibling actually refers to our
    // parent's lastChild, but we hide that
    return castToNodeImpl(thisNode)->isFirstChild() ? 0 : previousSibling;
}